

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>,std::error_code,unsigned_long>>
          (any_executor_base *this,
          binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
          *f)

{
  code *pcVar1;
  binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
  *in_RSI;
  long in_RDI;
  non_const_lvalue<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>_>
  f2;
  binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
  *other;
  binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
  *this_00;
  allocator<void> *in_stack_ffffffffffffff30;
  stream_core *in_stack_ffffffffffffff38;
  executor_function *in_stack_ffffffffffffff40;
  undefined1 local_30 [8];
  executor_function_view local_28;
  non_const_lvalue<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>_>
  local_18 [3];
  
  if (*(long *)(*(long *)(in_RDI + 0x28) + 0x18) == 0) {
    other = *(binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
              **)(*(long *)(in_RDI + 0x28) + 0x10);
    this_00 = (binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
               *)&stack0xffffffffffffff30;
    asio::detail::
    binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
    ::binder2(this_00,other);
    asio::detail::executor_function::
    executor_function<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>,std::error_code,unsigned_long>,std::allocator<void>>
              (in_stack_ffffffffffffff40,
               (binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
                *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    (*(code *)other)(in_RDI,local_30);
    asio::detail::executor_function::~executor_function((executor_function *)this_00);
    asio::detail::
    binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
    ::~binder2((binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>
                *)0x1eb779);
  }
  else {
    asio::detail::
    non_const_lvalue<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>,_std::error_code,_unsigned_long>_>
    ::non_const_lvalue(local_18,in_RSI);
    pcVar1 = *(code **)(*(long *)(in_RDI + 0x28) + 0x18);
    asio::detail::executor_function_view::
    executor_function_view<asio::detail::binder2<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>,std::error_code,unsigned_long>>
              (&local_28,local_18[0].value);
    (*pcVar1)(in_RDI,local_28.complete_,local_28.function_);
  }
  return;
}

Assistant:

void execute(ASIO_MOVE_ARG(F) f) const
  {
    if (target_fns_->blocking_execute != 0)
    {
      asio::detail::non_const_lvalue<F> f2(f);
      target_fns_->blocking_execute(*this, function_view(f2.value));
    }
    else
    {
      target_fns_->execute(*this,
          function(ASIO_MOVE_CAST(F)(f), std::allocator<void>()));
    }
  }